

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestDyndepImplicitInput::RegisterParserTestDyndepImplicitInput
          (RegisterParserTestDyndepImplicitInput *this)

{
  RegisterParserTestDyndepImplicitInput *this_local;
  
  RegisterTest(ParserTestDyndepImplicitInput::Create,"ParserTest.DyndepImplicitInput");
  return;
}

Assistant:

TEST_F(ParserTest, DyndepImplicitInput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build result: cat in | dd\n"
"  dyndep = dd\n"));
  Edge* edge = state.GetNode("result", 0)->in_edge();
  ASSERT_TRUE(edge->dyndep_);
  EXPECT_TRUE(edge->dyndep_->dyndep_pending());
  EXPECT_EQ(edge->dyndep_->path(), "dd");
}